

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O0

void * rw::d3d8::driverOpen(void *o,int32 param_2,int32 param_3)

{
  ObjPipeline *pOVar1;
  int32 param_2_local;
  int32 param_1_local;
  void *o_local;
  
  pOVar1 = makeDefaultPipeline();
  **(undefined8 **)(engine + 0x60) = pOVar1;
  *(undefined4 *)(*(long *)(engine + 0x60) + 8) = d3d::nativeRasterOffset;
  *(code **)(*(long *)(engine + 0x60) + 0x10) = d3d::rasterCreate;
  *(code **)(*(long *)(engine + 0x60) + 0x18) = d3d::rasterLock;
  *(code **)(*(long *)(engine + 0x60) + 0x20) = d3d::rasterUnlock;
  *(code **)(*(long *)(engine + 0x60) + 0x38) = d3d::rasterNumLevels;
  *(code **)(*(long *)(engine + 0x60) + 0x40) = d3d::imageFindRasterFormat;
  *(code **)(*(long *)(engine + 0x60) + 0x48) = d3d::rasterFromImage;
  *(code **)(*(long *)(engine + 0x60) + 0x50) = d3d::rasterToImage;
  return o;
}

Assistant:

static void*
driverOpen(void *o, int32, int32)
{
	engine->driver[PLATFORM_D3D8]->defaultPipeline = makeDefaultPipeline();

	engine->driver[PLATFORM_D3D8]->rasterNativeOffset = nativeRasterOffset;
	engine->driver[PLATFORM_D3D8]->rasterCreate       = rasterCreate;
	engine->driver[PLATFORM_D3D8]->rasterLock         = rasterLock;
	engine->driver[PLATFORM_D3D8]->rasterUnlock       = rasterUnlock;
	engine->driver[PLATFORM_D3D8]->rasterNumLevels    = rasterNumLevels;
	engine->driver[PLATFORM_D3D8]->imageFindRasterFormat = imageFindRasterFormat;
	engine->driver[PLATFORM_D3D8]->rasterFromImage    = rasterFromImage;
	engine->driver[PLATFORM_D3D8]->rasterToImage      = rasterToImage;
	return o;
}